

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

char * alloc_string(char *in)

{
  size_t __n;
  char *__dest;
  
  __n = strlen(in);
  __dest = (char *)malloc(__n + 1);
  if (__dest != (char *)0x0) {
    if (__n != 0) {
      memcpy(__dest,in,__n);
    }
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char* alloc_string(const char* in)
{
  size_t insize = strlen(in);
  char* out = (char*)lodepng_malloc(insize + 1);
  if(out)
  {
    size_t i;
    for(i = 0; i != insize; ++i)
    {
      out[i] = in[i];
    }
    out[i] = 0;
  }
  return out;
}